

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall
re2::DFA::RunWorkqOnByte
          (DFA *this,Workq *oldq,Workq *newq,int c,uint flag,bool *ismatch,MatchKind kind)

{
  int iVar1;
  Inst *pIVar2;
  uint uVar3;
  int *piVar4;
  LogMessage local_1b0;
  
  (newq->super_SparseSet).size_ = 0;
  newq->nextmark_ = newq->n_;
  if ((oldq->super_SparseSet).size_ != 0) {
    piVar4 = (oldq->super_SparseSet).dense_;
    do {
      iVar1 = *piVar4;
      if (iVar1 < oldq->n_) {
        pIVar2 = this->prog_->inst_;
        switch(pIVar2[iVar1].out_opcode_ & 7) {
        case 0:
          LogMessage::LogMessage
                    (&local_1b0,
                     "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",
                     0x3a2,3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1b0.str_,"unhandled opcode: ",0x12);
          std::ostream::operator<<((ostream *)&local_1b0.str_,pIVar2[iVar1].out_opcode_ & 7);
          LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
          break;
        case 2:
          uVar3 = c;
          if (pIVar2[iVar1].field_1.field_3.foldcase_ != '\0') {
            uVar3 = c | 0x20;
          }
          if (0x19 < c - 0x41U) {
            uVar3 = c;
          }
          if (((int)(uint)pIVar2[iVar1].field_1.field_3.lo_ <= (int)uVar3) &&
             ((int)uVar3 <= (int)(uint)pIVar2[iVar1].field_1.field_3.hi_)) {
            AddToQueue(this,newq,pIVar2[iVar1].out_opcode_ >> 4,flag);
          }
          break;
        case 5:
          if (((c == 0x100) || (this->prog_->anchor_end_ == false)) &&
             (*ismatch = true, kind == kFirstMatch)) {
            return;
          }
        }
      }
      else {
        if (*ismatch != false) {
          return;
        }
        if (newq->last_was_mark_ == false) {
          newq->last_was_mark_ = false;
          iVar1 = newq->nextmark_;
          newq->nextmark_ = iVar1 + 1;
          SparseSet::insert_new(&newq->super_SparseSet,iVar1);
        }
      }
      piVar4 = piVar4 + 1;
    } while (piVar4 != (oldq->super_SparseSet).dense_ + (oldq->super_SparseSet).size_);
  }
  return;
}

Assistant:

void DFA::RunWorkqOnByte(Workq* oldq, Workq* newq,
                         int c, uint flag, bool* ismatch,
                         Prog::MatchKind kind) {
  if (DEBUG_MODE)
    mutex_.AssertHeld();

  newq->clear();
  for (Workq::iterator i = oldq->begin(); i != oldq->end(); ++i) {
    if (oldq->is_mark(*i)) {
      if (*ismatch)
        return;
      newq->mark();
      continue;
    }
    int id = *i;
    Prog::Inst* ip = prog_->inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstFail:        // never succeeds
      case kInstCapture:     // already followed
      case kInstNop:         // already followed
      case kInstAltMatch:    // already followed
      case kInstEmptyWidth:  // already followed
        break;

      case kInstByteRange:   // can follow if c is in range
        if (ip->Matches(c))
          AddToQueue(newq, ip->out(), flag);
        break;

      case kInstMatch:
        if (prog_->anchor_end() && c != kByteEndText)
          break;
        *ismatch = true;
        if (kind == Prog::kFirstMatch) {
          // Can stop processing work queue since we found a match.
          return;
        }
        break;
    }
  }

  if (DebugDFA)
    fprintf(stderr, "%s on %d[%#x] -> %s [%d]\n", DumpWorkq(oldq).c_str(),
            c, flag, DumpWorkq(newq).c_str(), *ismatch);
}